

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool __thiscall google::anon_unknown_3::LineReader::ReadLine(LineReader *this,char **bol,char **eol)

{
  bool bVar1;
  ssize_t sVar2;
  char *pcVar3;
  int iVar4;
  ssize_t num_bytes_1;
  int capacity_left;
  char *append_pos;
  int incomplete_line_length;
  ssize_t num_bytes;
  char **eol_local;
  char **bol_local;
  LineReader *this_local;
  
  bVar1 = BufferIsEmpty(this);
  if (bVar1) {
    sVar2 = ReadFromOffset(this->fd_,this->buf_,(long)this->buf_len_,this->offset_);
    if (sVar2 < 1) {
      return false;
    }
    this->offset_ = sVar2 + this->offset_;
    this->eod_ = this->buf_ + sVar2;
    this->bol_ = this->buf_;
  }
  else {
    this->bol_ = this->eol_ + 1;
    if (this->eod_ < this->bol_) {
      AssertFail();
    }
    bVar1 = HasCompleteLine(this);
    if (!bVar1) {
      iVar4 = (int)this->eod_ - (int)this->bol_;
      memmove(this->buf_,this->bol_,(long)iVar4);
      pcVar3 = this->buf_;
      sVar2 = ReadFromOffset(this->fd_,pcVar3 + iVar4,(long)(this->buf_len_ - iVar4),this->offset_);
      if (sVar2 < 1) {
        return false;
      }
      this->offset_ = sVar2 + this->offset_;
      this->eod_ = pcVar3 + iVar4 + sVar2;
      this->bol_ = this->buf_;
    }
  }
  pcVar3 = FindLineFeed(this);
  this->eol_ = pcVar3;
  bVar1 = this->eol_ != (char *)0x0;
  if (bVar1) {
    *this->eol_ = '\0';
    *bol = this->bol_;
    *eol = this->eol_;
  }
  return bVar1;
}

Assistant:

bool ReadLine(const char **bol, const char **eol) {
    if (BufferIsEmpty()) {  // First time.
      const ssize_t num_bytes = ReadFromOffset(fd_, buf_, buf_len_, offset_);
      if (num_bytes <= 0) {  // EOF or error.
        return false;
      }
      offset_ += num_bytes;
      eod_ = buf_ + num_bytes;
      bol_ = buf_;
    } else {
      bol_ = eol_ + 1;  // Advance to the next line in the buffer.
      SAFE_ASSERT(bol_ <= eod_);  // "bol_" can point to "eod_".
      if (!HasCompleteLine()) {
        const int incomplete_line_length = eod_ - bol_;
        // Move the trailing incomplete line to the beginning.
        memmove(buf_, bol_, incomplete_line_length);
        // Read text from file and append it.
        char * const append_pos = buf_ + incomplete_line_length;
        const int capacity_left = buf_len_ - incomplete_line_length;
        const ssize_t num_bytes =
            ReadFromOffset(fd_, append_pos, capacity_left, offset_);
        if (num_bytes <= 0) {  // EOF or error.
          return false;
        }
        offset_ += num_bytes;
        eod_ = append_pos + num_bytes;
        bol_ = buf_;
      }
    }
    eol_ = FindLineFeed();
    if (eol_ == NULL) {  // '\n' not found.  Malformed line.
      return false;
    }
    *eol_ = '\0';  // Replace '\n' with '\0'.

    *bol = bol_;
    *eol = eol_;
    return true;
  }